

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoodsMulti
          (BeagleCPUImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *scaleBufferIndices,int count,double *outSumLogLikelihood
          )

{
  int iVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  int in_R9D;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double *in_stack_00000008;
  int i_4;
  int i_3;
  double tmpSum;
  double tmpScaleFactor;
  int j;
  double *cumulativeScaleFactors;
  int cumulativeScalingFactorIndex;
  int i_2;
  double sum;
  int k_2;
  int i_1;
  int k_1;
  int l;
  int i;
  int k;
  int v;
  int u;
  double *wt;
  double *frequencies;
  double *rootPartials;
  int rootPartialIndex;
  int subsetIndex;
  int returnCode;
  vector<double,_std::allocator<double>_> maxScaleFactor;
  vector<int,_std::allocator<int>_> indexMaxScale;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  size_type in_stack_fffffffffffffec8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffed0;
  value_type vVar17;
  int local_f8;
  int local_f4;
  value_type local_e8;
  int local_dc;
  int local_d0;
  int local_cc;
  double local_c8;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_84;
  int local_80;
  vector<double,_std::allocator<double>_> local_78 [2];
  vector<int,_std::allocator<int>_> local_48;
  int local_2c;
  int *local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_2c = in_R9D;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::allocator<int>::allocator((allocator<int> *)0x17bd97);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  std::allocator<int>::~allocator((allocator<int> *)0x17bdbd);
  std::allocator<double>::allocator((allocator<double> *)0x17bddd);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  std::allocator<double>::~allocator((allocator<double> *)0x17be03);
  local_80 = 0;
  for (local_84 = 0; local_84 < local_2c; local_84 = local_84 + 1) {
    iVar1 = *(int *)(local_10 + (long)local_84 * 4);
    lVar2 = *(long *)(*(long *)(in_RDI + 0xb0) + (long)iVar1 * 8);
    lVar3 = *(long *)(*(long *)(in_RDI + 0xa8) + (long)*(int *)(local_20 + (long)local_84 * 4) * 8);
    pdVar4 = *(double **)
              (*(long *)(in_RDI + 0xa0) + (long)*(int *)(local_18 + (long)local_84 * 4) * 8);
    local_a4 = 0;
    local_a8 = 0;
    for (local_ac = 0; local_ac < *(int *)(in_RDI + 0x14); local_ac = local_ac + 1) {
      for (local_b0 = 0; local_b0 < *(int *)(in_RDI + 0x24); local_b0 = local_b0 + 1) {
        *(double *)(*(long *)(in_RDI + 0xe0) + (long)local_a4 * 8) =
             *(double *)(lVar2 + (long)local_a8 * 8) * *pdVar4;
        local_a4 = local_a4 + 1;
        local_a8 = local_a8 + 1;
      }
    }
    for (local_b4 = 1; local_b4 < *(int *)(in_RDI + 0x34); local_b4 = local_b4 + 1) {
      local_a4 = 0;
      for (local_b8 = 0; local_b8 < *(int *)(in_RDI + 0x14); local_b8 = local_b8 + 1) {
        for (local_bc = 0; local_bc < *(int *)(in_RDI + 0x24); local_bc = local_bc + 1) {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = *(ulong *)(lVar2 + (long)local_a8 * 8);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = pdVar4[local_b4];
          auVar14._8_8_ = 0;
          auVar14._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_a4 * 8);
          auVar8 = vfmadd213sd_fma(auVar8,auVar11,auVar14);
          *(long *)(*(long *)(in_RDI + 0xe0) + (long)local_a4 * 8) = auVar8._0_8_;
          local_a4 = local_a4 + 1;
          local_a8 = local_a8 + 1;
        }
      }
    }
    local_a4 = 0;
    for (local_c0 = 0; local_c0 < *(int *)(in_RDI + 0x14); local_c0 = local_c0 + 1) {
      local_c8 = 0.0;
      for (local_cc = 0; local_cc < *(int *)(in_RDI + 0x24); local_cc = local_cc + 1) {
        auVar12._8_8_ = 0;
        auVar12._0_8_ = *(ulong *)(lVar3 + (long)local_cc * 8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)(*(long *)(in_RDI + 0xe0) + (long)local_a4 * 8);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = local_c8;
        auVar8 = vfmadd213sd_fma(auVar9,auVar12,auVar15);
        local_c8 = auVar8._0_8_;
        local_a4 = local_a4 + 1;
      }
      if ((*local_28 != -1) || ((*(ulong *)(in_RDI + 0x58) & 0x100) != 0)) {
        if ((*(ulong *)(in_RDI + 0x58) & 0x100) == 0) {
          local_d0 = local_28[local_84];
        }
        else {
          local_d0 = iVar1 - *(int *)(in_RDI + 0x10);
        }
        lVar2 = *(long *)(*(long *)(in_RDI + 0xc0) + (long)local_d0 * 8);
        if (local_84 == 0) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_c0);
          *pvVar5 = 0;
          vVar17 = *(value_type *)(lVar2 + (long)local_c0 * 8);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_78,(long)local_c0)
          ;
          *pvVar6 = vVar17;
          for (local_dc = 1; local_dc < local_2c; local_dc = local_dc + 1) {
            if ((*(ulong *)(in_RDI + 0x58) & 0x100) == 0) {
              local_e8 = *(value_type *)
                          (*(long *)(*(long *)(in_RDI + 0xc0) + (long)local_28[local_dc] * 8) +
                          (long)local_c0 * 8);
            }
            else {
              local_e8 = *(value_type *)
                          (*(long *)(*(long *)(in_RDI + 0xc0) +
                                    (long)(*(int *)(local_10 + (long)local_dc * 4) -
                                          *(int *)(in_RDI + 0x10)) * 8) + (long)local_c0 * 8);
            }
            vVar17 = local_e8;
            pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_78,(long)local_c0);
            if (*pvVar6 < vVar17) {
              in_stack_fffffffffffffec4 = local_dc;
              pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_c0);
              *pvVar5 = in_stack_fffffffffffffec4;
              pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (local_78,(long)local_c0);
              *pvVar6 = local_e8;
            }
          }
        }
        in_stack_fffffffffffffec0 = local_84;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_c0);
        if (in_stack_fffffffffffffec0 != *pvVar5) {
          dVar7 = *(double *)(lVar2 + (long)local_c0 * 8);
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_78,(long)local_c0)
          ;
          dVar7 = exp(dVar7 - *pvVar6);
          local_c8 = dVar7 * local_c8;
        }
      }
      if (local_84 == 0) {
        *(double *)(*(long *)(in_RDI + 0x110) + (long)local_c0 * 8) = local_c8;
      }
      else if (local_84 == local_2c + -1) {
        dVar7 = log(*(double *)(*(long *)(in_RDI + 0x110) + (long)local_c0 * 8) + local_c8);
        *(double *)(*(long *)(in_RDI + 0x110) + (long)local_c0 * 8) = dVar7;
      }
      else {
        *(double *)(*(long *)(in_RDI + 0x110) + (long)local_c0 * 8) =
             local_c8 + *(double *)(*(long *)(in_RDI + 0x110) + (long)local_c0 * 8);
      }
    }
  }
  if ((*local_28 != -1) || ((*(ulong *)(in_RDI + 0x58) & 0x100) != 0)) {
    for (local_f4 = 0; local_f4 < *(int *)(in_RDI + 0x14); local_f4 = local_f4 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](local_78,(long)local_f4);
      *(double *)(*(long *)(in_RDI + 0x110) + (long)local_f4 * 8) =
           *pvVar6 + *(double *)(*(long *)(in_RDI + 0x110) + (long)local_f4 * 8);
    }
  }
  *in_stack_00000008 = 0.0;
  for (local_f8 = 0; local_f8 < *(int *)(in_RDI + 0x14); local_f8 = local_f8 + 1) {
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x110) + (long)local_f8 * 8);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(ulong *)(*(long *)(in_RDI + 0x80) + (long)local_f8 * 8);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = *in_stack_00000008;
    auVar8 = vfmadd213sd_fma(auVar10,auVar13,auVar16);
    *in_stack_00000008 = auVar8._0_8_;
  }
  if ((*in_stack_00000008 != *in_stack_00000008) ||
     (NAN(*in_stack_00000008) || NAN(*in_stack_00000008))) {
    local_80 = -8;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  return local_80;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsMulti(const int* bufferIndices,
                                                         const int* categoryWeightsIndices,
                                                         const int* stateFrequenciesIndices,
                                                         const int* scaleBufferIndices,
                                                         int count,
                                                         double* outSumLogLikelihood) {
    // Here we do the 3 similar operations:
    //              1. to set the lnL to the contribution of the first subset,
    //              2. to add the lnL for other subsets up to the penultimate
    //              3. to add the final subset and take the lnL
    //      This form of the calc would not work when count == 1 because
    //              we need operation 1 and 3 in the preceding list.  This is not
    //              a problem, though as we deal with count == 1 in the previous
    //              branch.

    std::vector<int> indexMaxScale(kPatternCount);
    std::vector<REALTYPE> maxScaleFactor(kPatternCount);

    int returnCode = BEAGLE_SUCCESS;

    for (int subsetIndex = 0 ; subsetIndex < count; ++subsetIndex ) {
        const int rootPartialIndex = bufferIndices[subsetIndex];
        const REALTYPE* rootPartials = gPartials[rootPartialIndex];
        const REALTYPE* frequencies = gStateFrequencies[stateFrequenciesIndices[subsetIndex]];
        const REALTYPE* wt = gCategoryWeights[categoryWeightsIndices[subsetIndex]];
        int u = 0;
        int v = 0;
        for (int k = 0; k < kPatternCount; k++) {
            for (int i = 0; i < kStateCount; i++) {
                integrationTmp[u] = rootPartials[v] * (REALTYPE) wt[0];
                u++;
                v++;
            }
            v += P_PAD;
        }
        for (int l = 1; l < kCategoryCount; l++) {
            u = 0;
            for (int k = 0; k < kPatternCount; k++) {
                for (int i = 0; i < kStateCount; i++) {
                    integrationTmp[u] += rootPartials[v] * (REALTYPE) wt[l];
                    u++;
                    v++;
                }
                v += P_PAD;
            }
        }
        u = 0;
        for (int k = 0; k < kPatternCount; k++) {
            REALTYPE sum = 0.0;
            for (int i = 0; i < kStateCount; i++) {
                sum += ((REALTYPE)frequencies[i]) * integrationTmp[u];
                u++;
            }

            // TODO: allow only some subsets to have scale indices
            if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
                int cumulativeScalingFactorIndex;
                if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                    cumulativeScalingFactorIndex = rootPartialIndex - kTipCount;
                else
                    cumulativeScalingFactorIndex = scaleBufferIndices[subsetIndex];

                const REALTYPE* cumulativeScaleFactors = gScaleBuffers[cumulativeScalingFactorIndex];

                if (subsetIndex == 0) {
                    indexMaxScale[k] = 0;
                    maxScaleFactor[k] = cumulativeScaleFactors[k];
                    for (int j = 1; j < count; j++) {
                        REALTYPE tmpScaleFactor;
                        if (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)
                            tmpScaleFactor = gScaleBuffers[bufferIndices[j] - kTipCount][k];
                        else
                            tmpScaleFactor = gScaleBuffers[scaleBufferIndices[j]][k];

                        if (tmpScaleFactor > maxScaleFactor[k]) {
                            indexMaxScale[k] = j;
                            maxScaleFactor[k] = tmpScaleFactor;
                        }
                    }
                }

                if (subsetIndex != indexMaxScale[k])
                    sum *= exp((REALTYPE)(cumulativeScaleFactors[k] - maxScaleFactor[k]));
            }

            if (subsetIndex == 0) {
                outLogLikelihoodsTmp[k] = sum;
            } else if (subsetIndex == count - 1) {
                REALTYPE tmpSum = outLogLikelihoodsTmp[k] + sum;

                outLogLikelihoodsTmp[k] = log(tmpSum);
            } else {
                outLogLikelihoodsTmp[k] += sum;
            }
        }
    }

    if (scaleBufferIndices[0] != BEAGLE_OP_NONE || (kFlags & BEAGLE_FLAG_SCALING_ALWAYS)) {
        for(int i=0; i<kPatternCount; i++)
            outLogLikelihoodsTmp[i] += maxScaleFactor[i];
    }

    *outSumLogLikelihood = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumLogLikelihood += outLogLikelihoodsTmp[i] * gPatternWeights[i];
    }

    if (*outSumLogLikelihood != *outSumLogLikelihood)
        returnCode = BEAGLE_ERROR_FLOATING_POINT;

    return returnCode;

}